

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceDefaultInstance
          (FileGenerator *this,int idx,Printer *printer)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  reference this_00;
  Options *in_RCX;
  Options *pOVar4;
  Descriptor *descriptor;
  FieldDescriptor *field_00;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  FieldDescriptor *local_e0;
  FieldDescriptor *field;
  undefined1 local_d0 [4];
  int i;
  string local_b0;
  string local_90;
  pointer local_60;
  MessageGenerator *generator;
  Formatter format;
  Printer *printer_local;
  int idx_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)&generator,printer,&this->variables_);
  this_00 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::operator[](&this->message_generators_,(long)idx);
  local_60 = std::
             unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::get(this_00);
  MessageGenerator::GenerateConstexprConstructor
            (local_60,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  DefaultInstanceType_abi_cxx11_
            (&local_90,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,in_RCX);
  pOVar4 = (Options *)&local_60->classname_;
  Formatter::operator()
            ((Formatter *)&generator,
             "struct $1$ {\n  constexpr $1$()\n    : _instance(::$proto_ns$::internal::ConstantInitialized{}) {}\n  ~$1$() {}\n  union {\n    $2$ _instance;\n  };\n};\n"
             ,&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar4)
  ;
  std::__cxx11::string::~string((string *)&local_90);
  DefaultInstanceType_abi_cxx11_
            (&local_b0,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,pOVar4);
  DefaultInstanceName_abi_cxx11_
            ((string *)local_d0,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,pOVar4);
  Formatter::operator()
            ((Formatter *)&generator,"PROTOBUF_ATTRIBUTE_NO_DESTROY PROTOBUF_CONSTINIT $1$ $2$;\n",
             &local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
            );
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  field._4_4_ = 0;
  while( true ) {
    iVar1 = field._4_4_;
    uVar3 = Descriptor::field_count(local_60->descriptor_);
    pOVar4 = (Options *)(ulong)uVar3;
    if ((int)uVar3 <= iVar1) break;
    local_e0 = Descriptor::field(local_60->descriptor_,field._4_4_);
    bVar2 = IsStringInlined(local_e0,&this->options_);
    if (bVar2) {
      ClassName_abi_cxx11_(&local_100,(cpp *)local_60->descriptor_,descriptor);
      FieldName_abi_cxx11_(&local_120,(cpp *)local_e0,field_00);
      DefaultInstanceName_abi_cxx11_
                (&local_140,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,pOVar4);
      Formatter::operator()
                ((Formatter *)&generator,
                 "PROTOBUF_ATTRIBUTE_INIT_PRIORITY std::true_type $1$::_init_inline_$2$_ = ($3$._instance.$2$_.Init(), std::true_type{});\n"
                 ,&local_100,&local_120,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    field._4_4_ = field._4_4_ + 1;
  }
  if (((this->options_).lite_implicit_weak_fields & 1U) != 0) {
    DefaultInstanceType_abi_cxx11_
              (&local_160,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,pOVar4);
    DefaultInstancePtr_abi_cxx11_
              (&local_180,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,pOVar4);
    DefaultInstanceName_abi_cxx11_
              (&local_1a0,(cpp *)local_60->descriptor_,(Descriptor *)&this->options_,pOVar4);
    Formatter::operator()
              ((Formatter *)&generator,"$1$* $2$ = &$3$;\n",&local_160,&local_180,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
  }
  Formatter::~Formatter((Formatter *)&generator);
  return;
}

Assistant:

void FileGenerator::GenerateSourceDefaultInstance(int idx,
                                                  io::Printer* printer) {
  Formatter format(printer, variables_);
  MessageGenerator* generator = message_generators_[idx].get();
  generator->GenerateConstexprConstructor(printer);
  // Use a union to disable the destructor of the _instance member.
  // We can constant initialize, but the object will still have a non-trivial
  // destructor that we need to elide.
  format(
      "struct $1$ {\n"
      "  constexpr $1$()\n"
      "    : _instance(::$proto_ns$::internal::ConstantInitialized{}) {}\n"
      "  ~$1$() {}\n"
      "  union {\n"
      "    $2$ _instance;\n"
      "  };\n"
      "};\n",
      DefaultInstanceType(generator->descriptor_, options_),
      generator->classname_);
  // NO_DESTROY is not necessary for correctness. The empty destructor is
  // enough. However, the empty destructor fails to be elided in some
  // configurations (like non-opt or with certain sanitizers). NO_DESTROY is
  // there just to improve performance and binary size in these builds.
  format("PROTOBUF_ATTRIBUTE_NO_DESTROY PROTOBUF_CONSTINIT $1$ $2$;\n",
         DefaultInstanceType(generator->descriptor_, options_),
         DefaultInstanceName(generator->descriptor_, options_));

  for (int i = 0; i < generator->descriptor_->field_count(); i++) {
    const FieldDescriptor* field = generator->descriptor_->field(i);
    if (IsStringInlined(field, options_)) {
      // Force the initialization of the inlined string in the default instance.
      format(
          "PROTOBUF_ATTRIBUTE_INIT_PRIORITY std::true_type "
          "$1$::_init_inline_$2$_ = "
          "($3$._instance.$2$_.Init(), std::true_type{});\n",
          ClassName(generator->descriptor_), FieldName(field),
          DefaultInstanceName(generator->descriptor_, options_));
    }
  }

  if (options_.lite_implicit_weak_fields) {
    format("$1$* $2$ = &$3$;\n",
           DefaultInstanceType(generator->descriptor_, options_),
           DefaultInstancePtr(generator->descriptor_, options_),
           DefaultInstanceName(generator->descriptor_, options_));
  }
}